

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O0

void decusecount68k(FX *frame68k)

{
  ushort uVar1;
  DLword DVar2;
  LispPTR LVar3;
  uint uVar4;
  FX *frame68k_00;
  LispPTR *SAddr;
  FX *pFVar5;
  uint *puVar6;
  DLword local_30;
  int size;
  DLword *clink68k;
  Bframe *blink68k;
  DLword *alink68k;
  FX *frame68k_local;
  
  if ((frame68k != (FX *)0x0) && (alink68k = &frame68k->alink, frame68k != (FX *)Stackspace)) {
    while (DVar2 = StackOffsetFromNative(alink68k), DVar2 != 0) {
      if ((alink68k[1] & 0xff) != 0) {
        alink68k[1] = alink68k[1] & 0xff00 | (alink68k[1] & 0xff) - 1 & 0xff;
        return;
      }
      frame68k_00 = (FX *)NativeAligned2FromStackOffset((*alink68k & 0xfffe) - 10);
      if ((*(uint *)alink68k & 1) == 0) {
        LVar3 = LAddrFromNative(alink68k + -2);
        local_30 = (DLword)LVar3;
      }
      else {
        local_30 = alink68k[9];
      }
      SAddr = NativeAligned4FromStackOffset(local_30);
      if ((*(uint *)alink68k & 1) == 0) {
        DVar2 = *alink68k;
      }
      else {
        DVar2 = alink68k[8];
      }
      pFVar5 = (FX *)NativeAligned2FromStackOffset(DVar2 - 10);
      uVar1 = alink68k[5];
      LVar3 = LAddrFromNative(alink68k);
      uVar4 = (uint)uVar1 - (LVar3 & 0xffff);
      if ((alink68k[-1] >> 9 & 1) == 0) {
        if ((int)uVar4 < 1) {
          error("creating 0 length free stack block");
        }
        if ((uVar4 & 1) != 0) {
          error("creating odd length free stack block");
        }
        *(uint *)alink68k = uVar4 & 0xffff | 0xa0000000;
      }
      else {
        if ((int)(uVar4 + 2) < 1) {
          error("creating 0 length free stack block");
        }
        if ((uVar4 + 2 & 1) != 0) {
          error("creating odd length free stack block");
        }
        *(uint *)(alink68k + -2) = uVar4 + 2 & 0xffff | 0xa0000000;
      }
      if ((*SAddr & 0xff0000) == 0) {
        DVar2 = StackOffsetFromNative(SAddr);
        if ((int)(((uint)DVar2 - (uint)(ushort)*SAddr) + 2) < 1) {
          error("creating 0 length free stack block");
        }
        DVar2 = StackOffsetFromNative(SAddr);
        if (((DVar2 - (short)*SAddr) + 2 & 1) != 0) {
          error("creating odd length free stack block");
        }
        DVar2 = StackOffsetFromNative(SAddr);
        LVar3 = *SAddr;
        puVar6 = (uint *)NativeAligned2FromStackOffset((DLword)*SAddr);
        *puVar6 = ((uint)DVar2 - (uint)(ushort)LVar3) + 2 & 0xffff | 0xa0000000;
      }
      else {
        *(ushort *)((long)SAddr + 2) =
             *(ushort *)((long)SAddr + 2) & 0xff00 |
             (*(ushort *)((long)SAddr + 2) & 0xff) - 1 & 0xff;
      }
      alink68k = (DLword *)pFVar5;
      if (frame68k_00 != pFVar5) {
        decusecount68k(frame68k_00);
      }
    }
  }
  return;
}

Assistant:

void decusecount68k(FX *frame68k) {
  DLword *alink68k;
  Bframe *blink68k;
  DLword *clink68k;
  /*** DLword *ivar68k; */
  int size;

  if (FX_INVALIDP(frame68k)) return;
  CHECK_FX(frame68k);
  /* I don't check if \INTERRUPTABLE is NIL */
  while (StackOffsetFromNative(frame68k)) {
    if (frame68k->usecount != 0) {
      frame68k->usecount--;
      return;
    } else {
      alink68k = NativeAligned2FromStackOffset(GETALINK(frame68k));
      blink68k = (Bframe *)NativeAligned4FromStackOffset(GETBLINK(frame68k));
      clink68k = NativeAligned2FromStackOffset(GETCLINK(frame68k));

      size = FX_size(frame68k);

      if (((Bframe *)DUMMYBF(frame68k))->residual) { /* this frame has dummy BF */
        MAKEFREEBLOCK(((DLword *)frame68k) - DLWORDSPER_CELL, size + DLWORDSPER_CELL);
      } else {
        MAKEFREEBLOCK(frame68k, size);
      }

      if (blink68k->usecnt != 0) {
        blink68k->usecnt--;
      } else {
        /***    ivar68k=NativeAligned2FromStackOffset(blink68k->ivar);
            GETWORD(ivar68k)=STK_FSB_WORD;
            GETWORD(ivar68k+1)=ivar68k -(DLword *)blink68k +2; **/

        MAKEFREEBLOCK(NativeAligned2FromStackOffset(blink68k->ivar), BF_size(blink68k));
      }
      if (alink68k != clink68k) decusecount68k((FX *)alink68k);

      frame68k = (FX *)clink68k;

    } /* else end */

  } /*while end */
}